

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket-rpc.c++
# Opt level: O2

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::WebSocketMessageStream::tryReadMessage
          (WebSocketMessageStream *this,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  MessageStream MVar2;
  void *pvVar3;
  uint64_t uVar4;
  SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_c__:36:13)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_78;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  code *local_68;
  anon_class_16_1_38e0b97e_for_func local_60;
  MessageStream local_50;
  undefined *local_48;
  undefined *puStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  uVar4 = options._8_8_;
  (**(code **)(**(long **)(fdSpace.ptr + 2) + 0x30))
            (&local_78,*(long **)(fdSpace.ptr + 2),uVar4 * 8,options.traversalLimitInWords);
  local_68 = tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)
             ::$_0::operator();
  pPVar1 = ((local_78.ptr)->super_PromiseArenaMember).arena;
  local_60.options.traversalLimitInWords = uVar4;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_78.ptr - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_c__:36:13)>
                   *)((long)pvVar3 + 0x3d0);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,capnp::WebSocketMessageStream::tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::WebSocketMessageStream::tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0,void*&>
              (location_00,&local_78,&local_60,&local_68);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    ((local_78.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_c__:36:13)>
                   *)(local_78.ptr + -3);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,capnp::WebSocketMessageStream::tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::WebSocketMessageStream::tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0,void*&>
              (location_00,&local_78,&local_60,&local_68);
    local_78.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_48 = &DAT_0042a172;
  puStack_40 = &DAT_0042a1d1;
  local_38 = 0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_70.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<kj::Maybe<capnp::MessageReaderAndFds>>
            ((OwnPromiseNode *)&local_50,
             (Promise<kj::Maybe<capnp::MessageReaderAndFds>_> *)&local_70,location);
  MVar2._vptr_MessageStream = local_50._vptr_MessageStream;
  local_50._vptr_MessageStream = (_func_int **)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50);
  (this->super_MessageStream)._vptr_MessageStream = MVar2._vptr_MessageStream;
  local_30.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_78);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> WebSocketMessageStream::tryReadMessage(
    kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  return socket.receive(options.traversalLimitInWords * sizeof(word))
      .then([options](auto msg) -> kj::Promise<kj::Maybe<MessageReaderAndFds>> {
    KJ_SWITCH_ONEOF(msg) {
        KJ_CASE_ONEOF(closeMsg, kj::WebSocket::Close) {
          return kj::Maybe<MessageReaderAndFds>();
        }
        KJ_CASE_ONEOF(str, kj::String) {
          KJ_FAIL_REQUIRE(
              "Unexpected websocket text message; expected only binary messages.");
          break;
        }
        KJ_CASE_ONEOF(bytes, kj::Array<byte>) {
          kj::Own<capnp::MessageReader> reader;
          size_t sizeInWords = bytes.size() / sizeof(word);
          if (reinterpret_cast<uintptr_t>(bytes.begin()) % alignof(word) == 0) {
            reader = kj::heap<FlatArrayMessageReader>(
                kj::arrayPtr(
                  reinterpret_cast<word *>(bytes.begin()),
                  sizeInWords
                ),
                options).attach(kj::mv(bytes));
          } else {
            // The array is misaligned, so we need to copy it.
            auto words = kj::heapArray<word>(sizeInWords);

            // Note: can't just use bytes.size(), since the the target buffer may
            // be shorter due to integer division.
            memcpy(words.begin(), bytes.begin(), sizeInWords * sizeof(word));
            reader = kj::heap<FlatArrayMessageReader>(
                kj::arrayPtr(words.begin(), sizeInWords),
                options).attach(kj::mv(words));
          }
          return kj::Maybe<MessageReaderAndFds>(MessageReaderAndFds {
            kj::mv(reader),
            nullptr
          });
        }
      }
      KJ_UNREACHABLE;
    });
}